

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

int SHA1Result(SHA1Context *context,uint8_t *Message_Digest)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  
  iVar1 = 1;
  if ((Message_Digest != (uint8_t *)0x0 && context != (SHA1Context *)0x0) &&
     (iVar1 = context->Corrupted, iVar1 == 0)) {
    if (context->Computed == 0) {
      SHA1Finalize(context,0x80);
    }
    iVar1 = 0;
    bVar2 = 0;
    lVar3 = 0;
    do {
      Message_Digest[lVar3] =
           (uint8_t)(*(uint *)((long)context->Intermediate_Hash + (ulong)((uint)lVar3 & 0xfffffffc))
                    >> (~bVar2 & 0x18));
      lVar3 = lVar3 + 1;
      bVar2 = bVar2 + 8;
    } while (lVar3 != 0x14);
  }
  return iVar1;
}

Assistant:

int SHA1Result(SHA1Context *context,
    uint8_t Message_Digest[SHA1HashSize])
{
    int i;

    if (!context || !Message_Digest)
        return shaNull;

    if (context->Corrupted)
        return context->Corrupted;

    if (!context->Computed)
        SHA1Finalize(context, 0x80);

    for (i = 0; i < SHA1HashSize; ++i)
        Message_Digest[i] = (uint8_t)(context->Intermediate_Hash[i >> 2]
        >> 8 * (3 - (i & 0x03)));

    return shaSuccess;
}